

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>::basic_dynamic_gauge
          (basic_dynamic_gauge<double,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 *puVar8;
  string local_a8;
  string local_88;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_68;
  
  local_88._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (help->_M_dataplus)._M_p;
  paVar1 = &help->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar1) {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&help->field_2 + 8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a8._M_string_length = help->_M_string_length;
  (help->_M_dataplus)._M_p = (pointer)paVar1;
  help->_M_string_length = 0;
  (help->field_2)._M_local_buf[0] = '\0';
  lVar7 = 0x10;
  do {
    puVar8 = (undefined8 *)((long)&local_68._M_elems[0]._M_dataplus._M_p + lVar7);
    puVar2 = (undefined8 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar7);
    *(undefined8 **)((long)local_68._M_elems + lVar7 + -0x10) = puVar8;
    puVar4 = *(undefined8 **)((long)labels_name->_M_elems + lVar7 + -0x10);
    if (puVar2 == puVar4) {
      uVar6 = puVar2[1];
      *puVar8 = *puVar2;
      *(undefined8 *)((long)&local_68._M_elems[0]._M_string_length + lVar7) = uVar6;
    }
    else {
      *(undefined8 **)((long)local_68._M_elems + lVar7 + -0x10) = puVar4;
      *puVar8 = *puVar2;
    }
    *(undefined8 *)((long)local_68._M_elems + lVar7 + -8) =
         *(undefined8 *)((long)labels_name->_M_elems + lVar7 + -8);
    *(undefined8 **)((long)labels_name->_M_elems + lVar7 + -0x10) = puVar2;
    *(undefined8 *)((long)labels_name->_M_elems + lVar7 + -8) = 0;
    *(undefined1 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar7) = 0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x50);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::basic_dynamic_counter
            (&this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>,&local_88,&local_a8,
             &local_68);
  lVar7 = 0;
  do {
    plVar5 = *(long **)((long)&local_68._M_elems[1]._M_dataplus._M_p + lVar7);
    plVar3 = (long *)(local_68._M_elems[1].field_2._M_local_buf + lVar7);
    if (plVar3 != plVar5) {
      operator_delete(plVar5,*plVar3 + 1);
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
  super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_001ff928;
  (this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
  super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.super_dynamic_metric.
  super_metric_t.type_ = Gauge;
  return;
}

Assistant:

basic_dynamic_gauge(std::string name, std::string help,
                      std::array<std::string, N> labels_name)
      : Base(std::move(name), std::move(help), std::move(labels_name)) {
    set_metric_type(MetricType::Gauge);
  }